

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

size_t __thiscall rr::PrimitiveList::getIndex(PrimitiveList *this,size_t elementNdx)

{
  int iVar1;
  deUint32 dVar2;
  int index;
  size_t elementNdx_local;
  PrimitiveList *this_local;
  
  if (this->m_indices == (void *)0x0) {
    this_local = (PrimitiveList *)((long)this->m_baseVertex + elementNdx);
  }
  else {
    iVar1 = this->m_baseVertex;
    dVar2 = anon_unknown_19::readIndexArray(this->m_indexType,this->m_indices,elementNdx);
    this_local = (PrimitiveList *)(long)(int)(iVar1 + dVar2);
  }
  return (size_t)this_local;
}

Assistant:

size_t PrimitiveList::getIndex (size_t elementNdx) const
{
	// indices == DE_NULL interpreted as command.indices = [first (=baseVertex) + 0, first + 1, first + 2...]
	if (m_indices)
	{
		int index = m_baseVertex + (int)readIndexArray(m_indexType, m_indices, elementNdx);
		DE_ASSERT(index >= 0); // do not access indices < 0

		return (size_t)index;
	}
	else
		return (size_t)(m_baseVertex) + elementNdx;
}